

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_parse_http(char *s,int n,http_message *hm,int is_req)

{
  int len_00;
  int iVar1;
  byte *end_00;
  ushort **ppuVar2;
  char *pcVar3;
  void *pvVar4;
  bool bVar5;
  int len;
  char *qs;
  char *end;
  int is_req_local;
  http_message *hm_local;
  byte *pbStack_18;
  int n_local;
  char *s_local;
  
  len_00 = get_request_len(s,n);
  if (len_00 < 1) {
    return len_00;
  }
  memset(hm,0,0x578);
  (hm->message).p = s;
  (hm->body).p = s + len_00;
  (hm->body).len = 0xffffffffffffffff;
  (hm->message).len = 0xffffffffffffffff;
  end_00 = (byte *)(s + len_00);
  pbStack_18 = (byte *)s;
  while( true ) {
    bVar5 = false;
    if (pbStack_18 < end_00) {
      ppuVar2 = __ctype_b_loc();
      bVar5 = ((*ppuVar2)[(int)(uint)*pbStack_18] & 0x2000) != 0;
    }
    if (!bVar5) break;
    pbStack_18 = pbStack_18 + 1;
  }
  if (is_req == 0) {
    pcVar3 = mg_skip((char *)pbStack_18,(char *)end_00," ",&hm->proto);
    if (((long)end_00 - (long)pcVar3 < 4) || (pcVar3[3] != ' ')) {
      return -1;
    }
    iVar1 = atoi(pcVar3);
    hm->resp_code = iVar1;
    if ((hm->resp_code < 100) || (599 < hm->resp_code)) {
      return -1;
    }
    pbStack_18 = (byte *)mg_skip(pcVar3 + 4,(char *)end_00,"\r\n",&hm->resp_status_msg);
  }
  else {
    pcVar3 = mg_skip((char *)pbStack_18,(char *)end_00," ",&hm->method);
    pcVar3 = mg_skip(pcVar3,(char *)end_00," ",&hm->uri);
    pbStack_18 = (byte *)mg_skip(pcVar3,(char *)end_00,"\r\n",&hm->proto);
    if (((hm->uri).p <= (hm->method).p) || ((hm->proto).p <= (hm->uri).p)) {
      return -1;
    }
    pvVar4 = memchr((hm->uri).p,0x3f,(hm->uri).len);
    if (pvVar4 != (void *)0x0) {
      (hm->query_string).p = (char *)((long)pvVar4 + 1);
      (hm->query_string).len = (size_t)((hm->uri).p + ((hm->uri).len - ((long)pvVar4 + 1)));
      (hm->uri).len = (long)pvVar4 - (long)(hm->uri).p;
    }
  }
  parse_http_headers((char *)pbStack_18,(char *)end_00,len_00,hm);
  if (((((hm->body).len == 0xffffffffffffffff) && (is_req != 0)) &&
      (iVar1 = mg_vcasecmp(&hm->method,"PUT"), iVar1 != 0)) &&
     (iVar1 = mg_vcasecmp(&hm->method,"POST"), iVar1 != 0)) {
    (hm->body).len = 0;
    (hm->message).len = (long)len_00;
  }
  return len_00;
}

Assistant:

int mg_parse_http(const char *s, int n, struct http_message *hm, int is_req) {
    const char *end, *qs;
    int len = get_request_len(s, n);

    if (len <= 0) return len;

    memset(hm, 0, sizeof(*hm));
    hm->message.p = s;
    hm->body.p = s + len;
    hm->message.len = hm->body.len = (size_t) ~0;
    end = s + len;

    /* Request is fully buffered. Skip leading whitespaces. */
    while (s < end && isspace(*(unsigned char *) s)) s++;

    if (is_req) {
        /* Parse request line: method, URI, proto */
        s = mg_skip(s, end, " ", &hm->method);
        s = mg_skip(s, end, " ", &hm->uri);
        s = mg_skip(s, end, "\r\n", &hm->proto);
        if (hm->uri.p <= hm->method.p || hm->proto.p <= hm->uri.p) return -1;

        /* If URI contains '?' character, initialize query_string */
        if ((qs = (char *) memchr(hm->uri.p, '?', hm->uri.len)) != NULL) {
            hm->query_string.p = qs + 1;
            hm->query_string.len = &hm->uri.p[hm->uri.len] - (qs + 1);
            hm->uri.len = qs - hm->uri.p;
        }
    } else {
        s = mg_skip(s, end, " ", &hm->proto);
        if (end - s < 4 || s[3] != ' ') return -1;
        hm->resp_code = atoi(s);
        if (hm->resp_code < 100 || hm->resp_code >= 600) return -1;
        s += 4;
        s = mg_skip(s, end, "\r\n", &hm->resp_status_msg);
    }

    s = parse_http_headers(s, end, len, hm);

    /*
   * mg_parse_http() is used to parse both HTTP requests and HTTP
   * responses. If HTTP response does not have Content-Length set, then
   * body is read until socket is closed, i.e. body.len is infinite (~0).
   *
   * For HTTP requests though, according to
   * http://tools.ietf.org/html/rfc7231#section-8.1.3,
   * only POST and PUT methods have defined body semantics.
   * Therefore, if Content-Length is not specified and methods are
   * not one of PUT or POST, set body length to 0.
   *
   * So,
   * if it is HTTP request, and Content-Length is not set,
   * and method is not (PUT or POST) then reset body length to zero.
   */
    if (hm->body.len == (size_t) ~0 && is_req &&
        mg_vcasecmp(&hm->method, "PUT") != 0 &&
        mg_vcasecmp(&hm->method, "POST") != 0) {
        hm->body.len = 0;
        hm->message.len = len;
    }

    return len;
}